

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_cos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [24];
  undefined1 auVar63 [24];
  long *in_RDI;
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_cos op;
  Mat *m;
  __m256 y2;
  __m256 z;
  __m256 poly_mask;
  __m256 sign_bit;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  v4sf y2_1;
  v4sf z_1;
  v4sf poly_mask_1;
  v4sf sign_bit_1;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  int local_139c;
  undefined8 local_1398;
  undefined8 local_1390;
  undefined8 local_1388;
  undefined4 local_1380;
  long local_1378;
  undefined4 local_1370;
  undefined4 local_136c;
  undefined4 local_1368;
  undefined4 local_1364;
  undefined4 local_1360;
  undefined8 local_1358;
  undefined1 (*local_1350) [32];
  int local_1348;
  int local_1344;
  int local_1340;
  int local_133c;
  int local_1338;
  int local_1334;
  int local_1330;
  undefined1 local_1329 [9];
  long *local_1320;
  undefined1 local_1315;
  int local_1314;
  undefined8 *local_1308;
  undefined8 *local_1300;
  undefined8 *local_12f0;
  undefined1 (*local_12e8) [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 (*local_12b0) [32];
  undefined1 (*local_12a8) [32];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined1 (*local_1290) [32];
  long local_1288;
  undefined4 local_127c;
  long local_1278;
  undefined1 (*local_1270) [32];
  undefined4 local_1264;
  int local_1260;
  int local_125c;
  undefined8 *local_1258;
  undefined4 local_124c;
  long local_1248;
  undefined8 *local_1238;
  undefined8 *local_1210;
  undefined1 *local_1208;
  undefined8 *local_1200;
  undefined1 *local_11f8;
  undefined1 (*local_11f0) [32];
  undefined1 *local_11e8;
  undefined1 local_11e0 [8];
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  int local_1100;
  int iStack_10fc;
  int iStack_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int iStack_10e8;
  int iStack_10e4;
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  undefined1 local_10c0 [16];
  undefined1 local_10b0 [16];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [8];
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float *local_cd0;
  float *local_cc8;
  undefined1 *local_cc0;
  float *local_cb8;
  float *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  undefined8 *local_c98;
  undefined1 *local_c90;
  undefined1 *local_c88;
  undefined8 *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  undefined8 *local_c68;
  undefined1 *local_c60;
  undefined1 *local_c58;
  float *local_c50;
  float *local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  float afStack_9b0 [2];
  float afStack_9a8 [2];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0 [2];
  float afStack_8d8 [2];
  float afStack_8d0 [2];
  float afStack_8c8 [2];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined4 local_854;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined4 local_834;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  ulong uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  ulong uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined1 local_610 [8];
  undefined8 uStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 *local_3a8;
  float *local_3a0;
  float *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  float *local_378;
  float *local_370;
  undefined1 *local_368;
  float *local_360;
  float *local_358;
  undefined1 *local_350;
  float *local_348;
  float *local_340;
  undefined1 *local_338;
  float *local_330;
  float *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined8 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined8 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined8 *local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1330 = *(int *)((long)in_RDI + 0x2c);
  local_1334 = (int)in_RDI[6];
  local_1338 = *(int *)((long)in_RDI + 0x34);
  local_133c = (int)in_RDI[7];
  local_1340 = (int)in_RDI[3];
  local_1344 = local_1330 * local_1334 * local_1338 * local_1340;
  local_1320 = in_RDI;
  for (local_1348 = 0; local_1348 < local_133c; local_1348 = local_1348 + 1) {
    local_1308 = &local_1398;
    local_125c = *(int *)((long)local_1320 + 0x2c);
    local_1260 = (int)local_1320[6];
    local_1264 = *(undefined4 *)((long)local_1320 + 0x34);
    local_1270 = (undefined1 (*) [32])
                 (*local_1320 + local_1320[8] * (long)local_1348 * local_1320[2]);
    local_1278 = local_1320[2];
    local_127c = (undefined4)local_1320[3];
    local_1288 = local_1320[4];
    local_1258 = &local_1398;
    local_1248 = (long)local_125c * (long)local_1260 * local_1278;
    local_1300 = &local_1398;
    local_12f0 = &local_1398;
    local_124c = 0x10;
    local_1314 = local_1348;
    local_1315 = 1;
    local_1398 = 0;
    local_1388 = 0;
    local_1380 = 0;
    local_1370 = 0;
    local_136c = 0;
    local_1368 = 0;
    local_1364 = 0;
    local_1360 = 0;
    local_1358 = 0;
    local_1390 = 0;
    local_1350 = local_1270;
    for (local_139c = 0; local_139c + 7 < local_1344; local_139c = local_139c + 8) {
      local_12e8 = local_1350;
      uStack_f10 = *(undefined8 *)(*local_1350 + 0x10);
      uStack_f08 = *(undefined8 *)(*local_1350 + 0x18);
      local_1208 = local_1329;
      local_1210 = &local_13c0;
      local_f00 = ZEXT832(0) << 0x20;
      local_fe0._0_8_ = SUB168(*(undefined1 (*) [16])*local_1350,0);
      local_f20 = local_fe0._0_8_;
      local_fe0._8_8_ = SUB168(*(undefined1 (*) [16])*local_1350,8);
      uStack_f18 = local_fe0._8_8_;
      local_f40 = 0x7fffffff7fffffff;
      uStack_f38 = 0x7fffffff7fffffff;
      uStack_f30 = 0x7fffffff7fffffff;
      uStack_f28 = 0x7fffffff7fffffff;
      auVar20._8_8_ = 0x7fffffff7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._16_8_ = 0x7fffffff7fffffff;
      auVar20._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_1350,auVar20);
      local_fe0._0_8_ = auVar1._0_8_;
      uVar7 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar1._8_8_;
      uVar8 = local_fe0._8_8_;
      local_fe0._16_8_ = auVar1._16_8_;
      uVar9 = local_fe0._16_8_;
      local_fe0._24_8_ = auVar1._24_8_;
      uVar10 = local_fe0._24_8_;
      local_d20 = 0x3fa2f9833fa2f983;
      uStack_d18 = 0x3fa2f9833fa2f983;
      uStack_d10 = 0x3fa2f9833fa2f983;
      uStack_d08 = 0x3fa2f9833fa2f983;
      local_d00._0_4_ = auVar1._0_4_;
      local_d00._4_4_ = auVar1._4_4_;
      uStack_cf8._0_4_ = auVar1._8_4_;
      uStack_cf8._4_4_ = auVar1._12_4_;
      uStack_cf0._0_4_ = auVar1._16_4_;
      uStack_cf0._4_4_ = auVar1._20_4_;
      uStack_ce8._0_4_ = auVar1._24_4_;
      uStack_ce8._4_4_ = auVar1._28_4_;
      local_1060._4_4_ = local_d00._4_4_ * 1.2732395;
      local_1060._0_4_ = (float)local_d00 * 1.2732395;
      uStack_1058._0_4_ = (float)uStack_cf8 * 1.2732395;
      uStack_1058._4_4_ = uStack_cf8._4_4_ * 1.2732395;
      uStack_1050._0_4_ = (float)uStack_cf0 * 1.2732395;
      uStack_1050._4_4_ = uStack_cf0._4_4_ * 1.2732395;
      auVar62 = _local_1060;
      uStack_1048._0_4_ = (float)uStack_ce8 * 1.2732395;
      uStack_1048._4_4_ = uStack_ce8._4_4_;
      auVar2 = _local_1060;
      local_b00 = local_1060;
      uStack_af8 = uStack_1058;
      uStack_1050 = auVar62._16_8_;
      uStack_af0 = uStack_1050;
      uStack_1048 = auVar2._24_8_;
      uStack_ae8 = uStack_1048;
      local_1100 = (int)((float)local_d00 * 1.2732395);
      iStack_10fc = (int)(local_d00._4_4_ * 1.2732395);
      iStack_10f8 = (int)((float)uStack_cf8 * 1.2732395);
      iStack_10f4 = (int)(uStack_cf8._4_4_ * 1.2732395);
      iStack_10f0 = (int)((float)uStack_cf0 * 1.2732395);
      iStack_10ec = (int)(uStack_cf0._4_4_ * 1.2732395);
      iStack_10e8 = (int)((float)uStack_ce8 * 1.2732395);
      iStack_10e4 = (int)uStack_ce8._4_4_;
      local_870 = CONCAT44(iStack_10fc,local_1100);
      uStack_868 = CONCAT44(iStack_10f4,iStack_10f8);
      local_890 = CONCAT44(iStack_10ec,iStack_10f0);
      uStack_888 = CONCAT44(iStack_10e4,iStack_10e8);
      local_8a0 = 0x100000001;
      uStack_898 = 0x100000001;
      auVar6._8_8_ = uStack_868;
      auVar6._0_8_ = local_870;
      auVar3._8_8_ = 0x100000001;
      auVar3._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar6,auVar3);
      auVar5._8_8_ = uStack_888;
      auVar5._0_8_ = local_890;
      auVar4._8_8_ = 0x100000001;
      auVar4._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar5,auVar4);
      local_10d0._0_8_ = auVar3._0_8_;
      local_750 = local_10d0._0_8_;
      local_10d0._8_8_ = auVar3._8_8_;
      uStack_748 = local_10d0._8_8_;
      local_780 = 0xfffffffefffffffe;
      uStack_778 = 0xfffffffefffffffe;
      auVar30._8_8_ = 0xfffffffefffffffe;
      auVar30._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar3,auVar30);
      local_10e0._0_8_ = auVar4._0_8_;
      local_770 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar4._8_8_;
      uStack_768 = local_10e0._8_8_;
      auVar29._8_8_ = 0xfffffffefffffffe;
      auVar29._0_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx(auVar4,auVar29);
      local_10d0._0_8_ = auVar3._0_8_;
      local_1120 = local_10d0._0_8_;
      local_10d0._8_8_ = auVar3._8_8_;
      uStack_1118 = local_10d0._8_8_;
      local_10e0._0_8_ = auVar4._0_8_;
      uStack_1110 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar4._8_8_;
      uStack_1108 = local_10e0._8_8_;
      local_820 = local_10d0._0_8_;
      uStack_818 = local_10d0._8_8_;
      uStack_810 = local_10e0._0_8_;
      uStack_808 = local_10e0._8_8_;
      auVar24._16_8_ = local_10e0._0_8_;
      auVar24._0_16_ = auVar3;
      auVar24._24_8_ = local_10e0._8_8_;
      auVar2 = vcvtdq2ps_avx(auVar24);
      local_7d0 = local_10d0._0_8_;
      uStack_7c8 = local_10d0._8_8_;
      local_800 = 0x200000002;
      uStack_7f8 = 0x200000002;
      auVar26._8_8_ = 0x200000002;
      auVar26._0_8_ = 0x200000002;
      auVar5 = vpsubd_avx(auVar3,auVar26);
      local_7f0 = local_10e0._0_8_;
      uStack_7e8 = local_10e0._8_8_;
      auVar25._8_8_ = 0x200000002;
      auVar25._0_8_ = 0x200000002;
      auVar6 = vpsubd_avx(auVar4,auVar25);
      local_10d0._0_8_ = auVar5._0_8_;
      local_620 = local_10d0._0_8_;
      local_10d0._8_8_ = auVar5._8_8_;
      uStack_618 = local_10d0._8_8_;
      local_650 = 0x400000004;
      uStack_648 = 0x400000004;
      auVar33._8_8_ = 0x400000004;
      auVar33._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar5,auVar33);
      local_10e0._0_8_ = auVar6._0_8_;
      local_640 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar6._8_8_;
      uStack_638 = local_10e0._8_8_;
      auVar32._8_8_ = 0x400000004;
      auVar32._0_8_ = 0x400000004;
      auVar4 = vpandn_avx(auVar6,auVar32);
      local_10b0._0_8_ = auVar3._0_8_;
      local_830 = local_10b0._0_8_;
      local_10b0._8_8_ = auVar3._8_8_;
      uStack_828 = local_10b0._8_8_;
      local_834 = 0x1d;
      local_10b0 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_10c0._0_8_ = auVar4._0_8_;
      local_850 = local_10c0._0_8_;
      local_10c0._8_8_ = auVar4._8_8_;
      uStack_848 = local_10c0._8_8_;
      local_854 = 0x1d;
      local_10c0 = vpslld_avx(auVar4,ZEXT416(0x1d));
      local_1140 = local_10b0._0_8_;
      uStack_1138 = local_10b0._8_8_;
      uStack_1130 = local_10c0._0_8_;
      uStack_1128 = local_10c0._8_8_;
      local_1080 = local_10b0._0_8_;
      uStack_1078 = local_10b0._8_8_;
      uStack_1070 = local_10c0._0_8_;
      uStack_1068 = local_10c0._8_8_;
      local_790 = local_10d0._0_8_;
      uStack_788 = local_10d0._8_8_;
      auVar28._8_8_ = 0x200000002;
      auVar28._0_8_ = 0x200000002;
      auVar3 = vpand_avx(auVar5,auVar28);
      local_7b0 = local_10e0._0_8_;
      uStack_7a8 = local_10e0._8_8_;
      auVar27._8_8_ = 0x200000002;
      auVar27._0_8_ = 0x200000002;
      auVar4 = vpand_avx(auVar6,auVar27);
      local_10d0._0_8_ = auVar3._0_8_;
      local_710 = local_10d0._0_8_;
      local_10d0._8_8_ = auVar3._8_8_;
      uStack_708 = local_10d0._8_8_;
      local_700 = ZEXT816(0) << 0x20;
      local_720 = 0;
      local_6f0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_718 = local_6f0._8_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_6f0._8_8_;
      local_10d0 = vpcmpeqd_avx(auVar3,auVar59 << 0x40);
      local_10e0._0_8_ = auVar4._0_8_;
      local_730 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar4._8_8_;
      uStack_728 = local_10e0._8_8_;
      local_740 = 0;
      uStack_738 = local_6f0._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_6f0._8_8_;
      local_10e0 = vpcmpeqd_avx(auVar4,auVar60 << 0x40);
      local_1160 = local_10d0._0_8_;
      uStack_1158 = local_10d0._8_8_;
      uStack_1150 = local_10e0._0_8_;
      uStack_1148 = local_10e0._8_8_;
      local_10a0 = local_10d0._0_8_;
      uStack_1098 = local_10d0._8_8_;
      uStack_1090 = local_10e0._0_8_;
      uStack_1088 = local_10e0._8_8_;
      local_fa0 = local_10b0._0_8_;
      uStack_f98 = local_10b0._8_8_;
      uStack_f90 = local_10c0._0_8_;
      uStack_f88 = local_10c0._8_8_;
      local_1180 = local_10b0._0_8_;
      uStack_1178 = local_10b0._8_8_;
      uStack_1170 = local_10c0._0_8_;
      uStack_1168 = local_10c0._8_8_;
      local_fc0 = local_10d0._0_8_;
      uStack_fb8 = local_10d0._8_8_;
      uStack_fb0 = local_10e0._0_8_;
      uStack_fa8 = local_10e0._8_8_;
      local_11a0 = local_10d0._0_8_;
      uStack_1198 = local_10d0._8_8_;
      uStack_1190 = local_10e0._0_8_;
      uStack_1188 = local_10e0._8_8_;
      local_1000 = 0xbf490000bf490000;
      uStack_ff8 = 0xbf490000bf490000;
      uStack_ff0 = 0xbf490000bf490000;
      uStack_fe8 = 0xbf490000bf490000;
      local_1020 = 0xb97da000b97da000;
      uStack_1018 = 0xb97da000b97da000;
      uStack_1010 = 0xb97da000b97da000;
      uStack_1008 = 0xb97da000b97da000;
      local_cc0 = local_1060;
      local_c68 = &local_1000;
      local_ca0 = local_fe0;
      local_1060 = auVar2._0_8_;
      local_aa0 = local_1060;
      uStack_1058 = auVar2._8_8_;
      uStack_a98 = uStack_1058;
      uStack_1050 = auVar2._16_8_;
      uStack_a90 = uStack_1050;
      uStack_1048 = auVar2._24_8_;
      uStack_a88 = uStack_1048;
      local_ac0 = 0xbf490000bf490000;
      uStack_ab8 = 0xbf490000bf490000;
      uStack_ab0 = 0xbf490000bf490000;
      uStack_aa8 = 0xbf490000bf490000;
      auVar50._8_8_ = 0xbf490000bf490000;
      auVar50._0_8_ = 0xbf490000bf490000;
      auVar50._16_8_ = 0xbf490000bf490000;
      auVar50._24_8_ = 0xbf490000bf490000;
      local_ae0 = local_fe0._0_8_;
      uStack_ad8 = local_fe0._8_8_;
      uStack_ad0 = local_fe0._16_8_;
      uStack_ac8 = local_fe0._24_8_;
      auVar3 = vfmadd213ps_fma(auVar50,auVar2,auVar1);
      local_c80 = &local_1020;
      local_a40 = local_1060;
      uStack_a38 = uStack_1058;
      uStack_a30 = uStack_1050;
      uStack_a28 = uStack_1048;
      local_a60 = 0xb97da000b97da000;
      uStack_a58 = 0xb97da000b97da000;
      uStack_a50 = 0xb97da000b97da000;
      uStack_a48 = 0xb97da000b97da000;
      auVar49._8_8_ = 0xb97da000b97da000;
      auVar49._0_8_ = 0xb97da000b97da000;
      auVar49._16_8_ = 0xb97da000b97da000;
      auVar49._24_8_ = 0xb97da000b97da000;
      local_fe0._0_8_ = auVar3._0_8_;
      local_a80 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar3._8_8_;
      uStack_a78 = local_fe0._8_8_;
      uStack_a70 = 0;
      uStack_a68 = 0;
      auVar3 = vfmadd213ps_fma(auVar49,auVar2,ZEXT1632(auVar3));
      local_c98 = &local_1040;
      local_9e0 = local_1060;
      uStack_9d8 = uStack_1058;
      uStack_9d0 = uStack_1050;
      uStack_9c8 = uStack_1048;
      local_a00 = 0xb3222169b3222169;
      uStack_9f8 = 0xb3222169b3222169;
      uStack_9f0 = 0xb3222169b3222169;
      uStack_9e8 = 0xb3222169b3222169;
      auVar48._8_8_ = 0xb3222169b3222169;
      auVar48._0_8_ = 0xb3222169b3222169;
      auVar48._16_8_ = 0xb3222169b3222169;
      auVar48._24_8_ = 0xb3222169b3222169;
      local_fe0._0_8_ = auVar3._0_8_;
      local_a20 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar3._8_8_;
      uStack_a18 = local_fe0._8_8_;
      uStack_a10 = 0;
      uStack_a08 = 0;
      auVar3 = vfmadd213ps_fma(auVar48,auVar2,ZEXT1632(auVar3));
      uStack_1058 = 0x37ccf5ce37ccf5ce;
      local_1060 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      uStack_1050 = 0x37ccf5ce37ccf5ce;
      uStack_1048 = 0x37ccf5ce37ccf5ce;
      local_fe0._0_8_ = auVar3._0_8_;
      local_d60 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar3._8_8_;
      uStack_d58 = local_fe0._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d40._0_4_ = auVar3._0_4_;
      local_d40._4_4_ = auVar3._4_4_;
      uStack_d38._0_4_ = auVar3._8_4_;
      uStack_d38._4_4_ = auVar3._12_4_;
      uStack_11a4 = 0;
      local_11c0 = (float)local_d40 * (float)local_d40;
      fStack_11bc = local_d40._4_4_ * local_d40._4_4_;
      fStack_11b8 = (float)uStack_d38 * (float)uStack_d38;
      fStack_11b4 = uStack_d38._4_4_ * uStack_d38._4_4_;
      uStack_11b0 = 0;
      uStack_11ac = 0;
      uStack_11a8 = 0;
      local_cc8 = &local_11c0;
      local_cb8 = _ps256_coscof_p1;
      local_980 = 0x37ccf5ce37ccf5ce;
      uStack_978 = 0x37ccf5ce37ccf5ce;
      uStack_970 = 0x37ccf5ce37ccf5ce;
      uStack_968 = 0x37ccf5ce37ccf5ce;
      local_9a0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_998 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_990 = 0;
      uStack_988 = 0;
      local_9c0[0] = -0.0013887316;
      local_9c0[1] = -0.0013887316;
      afStack_9b8[0] = -0.0013887316;
      afStack_9b8[1] = -0.0013887316;
      afStack_9b0[0] = -0.0013887316;
      afStack_9b0[1] = -0.0013887316;
      afStack_9a8[0] = -0.0013887316;
      afStack_9a8[1] = -0.0013887316;
      auVar21._8_4_ = -0.0013887316;
      auVar21._12_4_ = -0.0013887316;
      auVar21._0_4_ = -0.0013887316;
      auVar21._4_4_ = -0.0013887316;
      auVar21._16_4_ = -0.0013887316;
      auVar21._20_4_ = -0.0013887316;
      auVar21._24_4_ = -0.0013887316;
      auVar21._28_4_ = -0.0013887316;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11b4,
                                                  CONCAT48(fStack_11b8,
                                                           CONCAT44(fStack_11bc,local_11c0)))),
                               _local_1060,auVar21);
      local_cd0 = _ps256_coscof_p2;
      local_1060 = auVar4._0_8_;
      local_920 = local_1060;
      uStack_1058 = auVar4._8_8_;
      uStack_918 = uStack_1058;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = CONCAT44(fStack_11bc,local_11c0);
      uStack_938 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_930 = 0;
      uStack_928 = 0;
      local_960[0] = 0.041666646;
      local_960[1] = 0.041666646;
      afStack_958[0] = 0.041666646;
      afStack_958[1] = 0.041666646;
      afStack_950[0] = 0.041666646;
      afStack_950[1] = 0.041666646;
      afStack_948[0] = 0.041666646;
      afStack_948[1] = 0.041666646;
      auVar22._8_4_ = 0.041666646;
      auVar22._12_4_ = 0.041666646;
      auVar22._0_4_ = 0.041666646;
      auVar22._4_4_ = 0.041666646;
      auVar22._16_4_ = 0.041666646;
      auVar22._20_4_ = 0.041666646;
      auVar22._24_4_ = 0.041666646;
      auVar22._28_4_ = 0.041666646;
      auVar4 = vfmadd213ps_fma(ZEXT1632(CONCAT412(fStack_11b4,
                                                  CONCAT48(fStack_11b8,
                                                           CONCAT44(fStack_11bc,local_11c0)))),
                               ZEXT1632(auVar4),auVar22);
      local_1060 = auVar4._0_8_;
      uVar11 = local_1060;
      uStack_1058 = auVar4._8_8_;
      uVar12 = uStack_1058;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_da0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_d98 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_d80._0_4_ = auVar4._0_4_;
      local_d80._4_4_ = auVar4._4_4_;
      uStack_d78._0_4_ = auVar4._8_4_;
      uStack_d78._4_4_ = auVar4._12_4_;
      local_1060._4_4_ = local_d80._4_4_ * fStack_11bc;
      local_1060._0_4_ = (float)local_d80 * local_11c0;
      uStack_1058._0_4_ = (float)uStack_d78 * fStack_11b8;
      uStack_1058._4_4_ = uStack_d78._4_4_ * fStack_11b4;
      local_dc0 = local_1060;
      uStack_db8 = uStack_1058;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_dd8 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      local_1060._4_4_ = local_d80._4_4_ * fStack_11bc * fStack_11bc;
      local_1060._0_4_ = (float)local_d80 * local_11c0 * local_11c0;
      local_900 = local_1060;
      uStack_1058._0_4_ = (float)uStack_d78 * fStack_11b8 * fStack_11b8;
      uStack_1058._4_4_ = uStack_d78._4_4_ * fStack_11b4 * fStack_11b4;
      auVar4 = _local_1060;
      _local_1060 = ZEXT1632(_local_1060);
      auVar1 = _local_1060;
      local_c50 = ::_ps256_0p5;
      local_8c0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_8b8 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0[0] = 0.5;
      local_8e0[1] = 0.5;
      afStack_8d8[0] = 0.5;
      afStack_8d8[1] = 0.5;
      afStack_8d0[0] = 0.5;
      afStack_8d0[1] = 0.5;
      afStack_8c8[0] = 0.5;
      afStack_8c8[1] = 0.5;
      uStack_1058 = auVar4._8_8_;
      uStack_8f8 = uStack_1058;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      auVar23._8_4_ = 0.5;
      auVar23._12_4_ = 0.5;
      auVar23._0_4_ = 0.5;
      auVar23._4_4_ = 0.5;
      auVar23._16_4_ = 0.5;
      auVar23._20_4_ = 0.5;
      auVar23._24_4_ = 0.5;
      auVar23._28_4_ = 0.5;
      auVar4 = vfnmadd213ps_fma(auVar23,ZEXT1632(CONCAT412(fStack_11b4,
                                                           CONCAT48(fStack_11b8,
                                                                    CONCAT44(fStack_11bc,local_11c0)
                                                                   ))),auVar1);
      local_1060 = auVar4._0_8_;
      uVar13 = local_1060;
      uStack_1058 = auVar4._8_8_;
      uVar14 = uStack_1058;
      uStack_b10 = 0;
      uStack_b08 = 0;
      local_b40 = 0x3f8000003f800000;
      uStack_b38 = 0x3f8000003f800000;
      uStack_b30 = 0x3f8000003f800000;
      uStack_b28 = 0x3f8000003f800000;
      local_b20._0_4_ = auVar4._0_4_;
      local_b20._4_4_ = auVar4._4_4_;
      uStack_b18._0_4_ = auVar4._8_4_;
      uStack_b18._4_4_ = auVar4._12_4_;
      local_1060._4_4_ = local_b20._4_4_ + 1.0;
      local_1060._0_4_ = (float)local_b20 + 1.0;
      uStack_1058._0_4_ = (float)uStack_b18 + 1.0;
      uStack_1058._4_4_ = uStack_b18._4_4_ + 1.0;
      uStack_1050._0_4_ = 0x3f800000;
      uStack_1050._4_4_ = 0x3f800000;
      auVar63 = _local_1060;
      uStack_1048._0_4_ = 0x3f800000;
      uStack_1048._4_4_ = 0x3f800000;
      auVar20 = _local_1060;
      local_e00 = 0xb94ca1f9b94ca1f9;
      uStack_df8 = 0xb94ca1f9b94ca1f9;
      uStack_df0 = 0xb94ca1f9b94ca1f9;
      uStack_de8 = 0xb94ca1f9b94ca1f9;
      local_e20 = CONCAT44(fStack_11bc,local_11c0);
      uStack_e18 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_11e0._4_4_ = fStack_11bc * -0.00019515296;
      local_11e0._0_4_ = local_11c0 * -0.00019515296;
      uStack_11d8._0_4_ = fStack_11b8 * -0.00019515296;
      uStack_11d8._4_4_ = fStack_11b4 * -0.00019515296;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar62 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xb94ca1f9;
      auVar1 = _local_11e0;
      local_b60 = local_11e0;
      uStack_b58 = uStack_11d8;
      uStack_11d0 = auVar62._16_8_;
      uStack_b50 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_b48 = uStack_11c8;
      local_b80 = 0x3c08839e3c08839e;
      uStack_b78 = 0x3c08839e3c08839e;
      uStack_b70 = 0x3c08839e3c08839e;
      uStack_b68 = 0x3c08839e3c08839e;
      local_11e0._0_4_ = local_11c0 * -0.00019515296 + 0.008332161;
      local_11e0._4_4_ = fStack_11bc * -0.00019515296 + 0.008332161;
      fVar67 = fStack_11b8 * -0.00019515296 + 0.008332161;
      fVar68 = fStack_11b4 * -0.00019515296 + 0.008332161;
      uStack_11d8._0_4_ = fVar67;
      uStack_11d8._4_4_ = fVar68;
      uStack_11d0._0_4_ = 0x3c08839e;
      uStack_11d0._4_4_ = 0x3c08839e;
      auVar62 = _local_11e0;
      uStack_11c8._0_4_ = 0x3c08839e;
      uStack_11c8._4_4_ = 0x3c055116;
      auVar1 = _local_11e0;
      local_e40 = local_11e0;
      uStack_e38 = uStack_11d8;
      uStack_11d0 = auVar62._16_8_;
      uStack_e30 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_e28 = uStack_11c8;
      local_e60 = CONCAT44(fStack_11bc,local_11c0);
      uStack_e58 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_e50 = 0;
      uStack_e48 = 0;
      fVar64 = (float)local_11e0._0_4_ * local_11c0;
      fVar66 = (float)local_11e0._4_4_ * fStack_11bc;
      fVar67 = fVar67 * fStack_11b8;
      fVar68 = fVar68 * fStack_11b4;
      local_11e0._4_4_ = fVar66;
      local_11e0._0_4_ = fVar64;
      local_ba0 = local_11e0;
      uStack_11d8._0_4_ = fVar67;
      uStack_11d8._4_4_ = fVar68;
      auVar4 = _local_11e0;
      _local_11e0 = ZEXT1628(_local_11e0);
      uStack_11c8._4_4_ = 0x3c055116;
      auVar1 = _local_11e0;
      uStack_11d8 = auVar4._8_8_;
      uStack_b98 = uStack_11d8;
      uStack_b90 = 0;
      uStack_11c8 = auVar1._24_8_;
      uStack_b88 = uStack_11c8;
      local_bc0 = 0xbe2aaaa3be2aaaa3;
      uStack_bb8 = 0xbe2aaaa3be2aaaa3;
      uStack_bb0 = 0xbe2aaaa3be2aaaa3;
      uStack_ba8 = 0xbe2aaaa3be2aaaa3;
      local_11e0._0_4_ = fVar64 + -0.16666655;
      local_11e0._4_4_ = fVar66 + -0.16666655;
      fVar67 = fVar67 + -0.16666655;
      fVar68 = fVar68 + -0.16666655;
      uStack_11d8._0_4_ = fVar67;
      uStack_11d8._4_4_ = fVar68;
      uStack_11d0._0_4_ = 0xbe2aaaa3;
      uStack_11d0._4_4_ = 0xbe2aaaa3;
      auVar62 = _local_11e0;
      uStack_11c8._0_4_ = 0xbe2aaaa3;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar1 = _local_11e0;
      local_e80 = local_11e0;
      uStack_e78 = uStack_11d8;
      uStack_11d0 = auVar62._16_8_;
      uStack_e70 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_e68 = uStack_11c8;
      local_ea0 = CONCAT44(fStack_11bc,local_11c0);
      uStack_e98 = CONCAT44(fStack_11b4,fStack_11b8);
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_11e0._0_4_ = (float)local_11e0._0_4_ * local_11c0;
      local_11e0._4_4_ = (float)local_11e0._4_4_ * fStack_11bc;
      fVar67 = fVar67 * fStack_11b8;
      fVar68 = fVar68 * fStack_11b4;
      uStack_11d8._0_4_ = fVar67;
      uStack_11d8._4_4_ = fVar68;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar62 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar1 = _local_11e0;
      local_ec0 = local_11e0;
      uStack_eb8 = uStack_11d8;
      uStack_11d0 = auVar62._16_8_;
      uStack_eb0 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_ea8 = uStack_11c8;
      local_ee0 = local_fe0._0_8_;
      uStack_ed8 = local_fe0._8_8_;
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_11e0._0_4_ = (float)local_11e0._0_4_ * (float)local_d40;
      local_11e0._4_4_ = (float)local_11e0._4_4_ * local_d40._4_4_;
      fVar67 = fVar67 * (float)uStack_d38;
      fVar68 = fVar68 * uStack_d38._4_4_;
      uStack_11d8._0_4_ = fVar67;
      uStack_11d8._4_4_ = fVar68;
      uStack_11d0._0_4_ = 0x80000000;
      uStack_11d0._4_4_ = 0x80000000;
      auVar62 = _local_11e0;
      uStack_11c8._0_4_ = 0x80000000;
      uStack_11c8._4_4_ = 0xbe225592;
      auVar1 = _local_11e0;
      local_be0 = local_11e0;
      uStack_bd8 = uStack_11d8;
      uStack_11d0 = auVar62._16_8_;
      uStack_bd0 = uStack_11d0;
      uStack_11c8 = auVar1._24_8_;
      uStack_bc8 = uStack_11c8;
      local_c00 = local_fe0._0_8_;
      uStack_bf8 = local_fe0._8_8_;
      uStack_bf0 = 0;
      uStack_be8 = 0;
      local_11e0._4_4_ = (float)local_11e0._4_4_ + local_d40._4_4_;
      local_11e0._0_4_ = (float)local_11e0._0_4_ + (float)local_d40;
      local_f80 = local_11e0;
      uStack_11d8._0_4_ = fVar67 + (float)uStack_d38;
      uStack_11d8._4_4_ = fVar68 + uStack_d38._4_4_;
      auVar4 = _local_11e0;
      _local_11e0 = ZEXT1628(_local_11e0);
      uStack_11c8._4_4_ = 0xbe225592;
      auVar1 = _local_11e0;
      local_1040 = local_10d0._0_8_;
      uStack_1038 = local_10d0._8_8_;
      uStack_1030 = local_10e0._0_8_;
      uStack_1028 = local_10e0._8_8_;
      local_f60 = local_10d0._0_8_;
      uStack_f58 = local_10d0._8_8_;
      uStack_f50 = local_10e0._0_8_;
      uStack_f48 = local_10e0._8_8_;
      uStack_11d8 = auVar4._8_8_;
      uStack_f78 = uStack_11d8;
      uStack_f70 = 0;
      uStack_11c8 = auVar1._24_8_;
      uStack_f68 = uStack_11c8;
      auVar19._16_8_ = local_10e0._0_8_;
      auVar19._0_16_ = local_10d0;
      auVar19._24_8_ = local_10e0._8_8_;
      auVar2._16_8_ = 0;
      auVar2._0_16_ = auVar4;
      auVar2._24_8_ = uStack_11c8;
      _local_11e0 = vandps_avx(auVar19,auVar2);
      local_6a0 = local_1060;
      uStack_698 = uStack_1058;
      uStack_1050 = auVar63._16_8_;
      uStack_690 = uStack_1050;
      uStack_1048 = auVar20._24_8_;
      uStack_688 = uStack_1048;
      local_680._0_4_ = local_10d0._0_4_;
      local_680._4_4_ = local_10d0._4_4_;
      uStack_678._0_4_ = local_10d0._8_4_;
      uStack_678._4_4_ = local_10d0._12_4_;
      uStack_670._0_4_ = local_10e0._0_4_;
      uStack_670._4_4_ = local_10e0._4_4_;
      uStack_668._0_4_ = local_10e0._8_4_;
      uStack_668._4_4_ = local_10e0._12_4_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar65._0_4_ = (uint)local_680 ^ auVar1._0_4_;
      auVar65._4_4_ = local_680._4_4_ ^ auVar1._4_4_;
      auVar65._8_4_ = (uint)uStack_678 ^ auVar1._8_4_;
      auVar65._12_4_ = uStack_678._4_4_ ^ auVar1._12_4_;
      auVar65._16_4_ = (uint)uStack_670 ^ auVar1._16_4_;
      auVar65._20_4_ = uStack_670._4_4_ ^ auVar1._20_4_;
      auVar65._24_4_ = (uint)uStack_668 ^ auVar1._24_4_;
      auVar65._28_4_ = uStack_668._4_4_ ^ auVar1._28_4_;
      auVar31._16_8_ = uStack_1050;
      auVar31._0_16_ = _local_1060;
      auVar31._24_8_ = uStack_1048;
      auVar1 = vandps_avx(auVar65,auVar31);
      local_1060 = auVar1._0_8_;
      uVar15 = local_1060;
      uStack_1058 = auVar1._8_8_;
      uVar16 = uStack_1058;
      uStack_1050 = auVar1._16_8_;
      uVar17 = uStack_1050;
      uStack_1048 = auVar1._24_8_;
      uVar18 = uStack_1048;
      local_c20._0_4_ = auVar1._0_4_;
      local_c20._4_4_ = auVar1._4_4_;
      uStack_c18._0_4_ = auVar1._8_4_;
      uStack_c18._4_4_ = auVar1._12_4_;
      uStack_c10._0_4_ = auVar1._16_4_;
      uStack_c10._4_4_ = auVar1._20_4_;
      uStack_c08._0_4_ = auVar1._24_4_;
      uStack_c08._4_4_ = auVar1._28_4_;
      local_c40._0_4_ = local_11e0._0_4_;
      local_c40._4_4_ = local_11e0._4_4_;
      uStack_c38._0_4_ = local_11e0._8_4_;
      uStack_c38._4_4_ = local_11e0._12_4_;
      uStack_c30._0_4_ = local_11e0._16_4_;
      uStack_c30._4_4_ = local_11e0._20_4_;
      uStack_c28._0_4_ = local_11e0._24_4_;
      uStack_c28._4_4_ = local_11e0._28_4_;
      local_1060._4_4_ = local_c20._4_4_ + local_c40._4_4_;
      local_1060._0_4_ = (float)local_c20 + (float)local_c40;
      uStack_1058._0_4_ = (float)uStack_c18 + (float)uStack_c38;
      uStack_1058._4_4_ = uStack_c18._4_4_ + uStack_c38._4_4_;
      uStack_1050._0_4_ = (float)uStack_c10 + (float)uStack_c30;
      uStack_1050._4_4_ = uStack_c10._4_4_ + uStack_c30._4_4_;
      auVar62 = _local_1060;
      uStack_1048._0_4_ = (float)uStack_c08 + (float)uStack_c28;
      uStack_1048._4_4_ = uStack_c08._4_4_ + uStack_c28._4_4_;
      auVar1 = _local_1060;
      local_6c0 = local_1060;
      uStack_6b8 = uStack_1058;
      uStack_1050 = auVar62._16_8_;
      uStack_6b0 = uStack_1050;
      uStack_1048 = auVar1._24_8_;
      uStack_6a8 = uStack_1048;
      local_6e0 = local_10b0._0_8_;
      uStack_6d8 = local_10b0._8_8_;
      uStack_6d0 = local_10c0._0_8_;
      uStack_6c8 = local_10c0._8_8_;
      local_1060._4_4_ = (uint)(local_c20._4_4_ + local_c40._4_4_) ^ local_10b0._4_4_;
      local_1060._0_4_ = (uint)((float)local_c20 + (float)local_c40) ^ local_10b0._0_4_;
      uStack_1058._0_4_ = (uint)((float)uStack_c18 + (float)uStack_c38) ^ local_10b0._8_4_;
      uStack_1058._4_4_ = (uint)(uStack_c18._4_4_ + uStack_c38._4_4_) ^ local_10b0._12_4_;
      uStack_1050._0_4_ = (uint)((float)uStack_c10 + (float)uStack_c30) ^ local_10c0._0_4_;
      uStack_1050._4_4_ = (uint)(uStack_c10._4_4_ + uStack_c30._4_4_) ^ local_10c0._4_4_;
      auVar62 = _local_1060;
      uStack_1048._0_4_ = (uint)((float)uStack_c08 + (float)uStack_c28) ^ local_10c0._8_4_;
      uStack_1048._4_4_ = (uint)(uStack_c08._4_4_ + uStack_c28._4_4_) ^ local_10c0._12_4_;
      auVar2 = _local_1060;
      local_13c0 = local_1060;
      uStack_13b8 = uStack_1058;
      uStack_1050 = auVar62._16_8_;
      uStack_13b0 = uStack_1050;
      uStack_1048 = auVar2._24_8_;
      uStack_13a8 = uStack_1048;
      local_12b0 = local_1350;
      local_12e0 = local_1060;
      uStack_12d8 = uStack_1058;
      uStack_12d0 = uStack_1050;
      uStack_12c8 = uStack_1048;
      auVar1._16_8_ = uStack_1050;
      auVar1._0_16_ = _local_1060;
      auVar1._24_8_ = uStack_1048;
      *local_1350 = auVar1;
      local_1350 = local_1350 + 1;
      _local_1060 = auVar2;
      local_fe0 = ZEXT1632(auVar3);
      local_d80 = uVar11;
      uStack_d78 = uVar12;
      local_d40 = local_d60;
      uStack_d38 = uStack_d58;
      uStack_d30 = uStack_d50;
      uStack_d28 = uStack_d48;
      local_d00 = uVar7;
      uStack_cf8 = uVar8;
      uStack_cf0 = uVar9;
      uStack_ce8 = uVar10;
      local_cb0 = local_cc8;
      local_ca8 = local_cc0;
      local_c90 = local_cc0;
      local_c88 = local_ca0;
      local_c78 = local_cc0;
      local_c70 = local_ca0;
      local_c60 = local_cc0;
      local_c58 = local_cc0;
      local_c48 = local_cc8;
      local_c40 = local_11e0;
      uStack_c38 = uStack_11d8;
      uStack_c30 = uStack_11d0;
      uStack_c28 = uStack_11c8;
      local_c20 = uVar15;
      uStack_c18 = uVar16;
      uStack_c10 = uVar17;
      uStack_c08 = uVar18;
      local_b20 = uVar13;
      uStack_b18 = uVar14;
      local_880 = local_8a0;
      uStack_878 = uStack_898;
      local_7e0 = local_800;
      uStack_7d8 = uStack_7f8;
      local_7c0 = local_800;
      uStack_7b8 = uStack_7f8;
      local_7a0 = local_800;
      uStack_798 = uStack_7f8;
      local_760 = local_780;
      uStack_758 = uStack_778;
      local_6f0 = local_700;
      local_680 = local_10d0._0_8_;
      uStack_678 = local_10d0._8_8_;
      uStack_670 = local_10e0._0_8_;
      uStack_668 = local_10e0._8_8_;
      local_630 = local_650;
      uStack_628 = uStack_648;
    }
    for (; local_1238 = local_12f0, local_1378 = local_1288, local_139c + 3 < local_1344;
        local_139c = local_139c + 4) {
      local_12a8 = local_1350;
      local_510 = *(undefined8 *)*local_1350;
      uStack_508 = *(undefined8 *)(*local_1350 + 8);
      local_11f8 = local_1329;
      local_1200 = &local_13d0;
      local_500 = ZEXT816(0) << 0x20;
      local_520 = 0x7fffffff7fffffff;
      uStack_518 = 0x7fffffff7fffffff;
      auVar34._8_8_ = 0x7fffffff7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_1350,auVar34);
      local_570._0_8_ = auVar4._0_8_;
      uVar7 = local_570._0_8_;
      local_570._8_8_ = auVar4._8_8_;
      uVar8 = local_570._8_8_;
      local_470 = 0x3fa2f9833fa2f983;
      uStack_468 = 0x3fa2f9833fa2f983;
      local_460._0_4_ = auVar4._0_4_;
      local_460._4_4_ = auVar4._4_4_;
      uStack_458._0_4_ = auVar4._8_4_;
      uStack_458._4_4_ = auVar4._12_4_;
      local_5b0._4_4_ = local_460._4_4_ * 1.2732395;
      local_5b0._0_4_ = (float)local_460 * 1.2732395;
      uStack_5a8._0_4_ = (float)uStack_458 * 1.2732395;
      uStack_5a8._4_4_ = uStack_458._4_4_ * 1.2732395;
      local_3d0 = local_5b0;
      uStack_3c8 = uStack_5a8;
      local_5d0._4_4_ = (int)(local_460._4_4_ * 1.2732395);
      local_5d0._0_4_ = (int)((float)local_460 * 1.2732395);
      local_5d0._8_4_ = (int)((float)uStack_458 * 1.2732395);
      local_5d0._12_4_ = (int)(uStack_458._4_4_ * 1.2732395);
      local_440 = local_5d0._0_8_;
      uStack_438 = local_5d0._8_8_;
      local_450 = 0x100000001;
      uStack_448 = 0x100000001;
      auVar36._8_8_ = local_5d0._8_8_;
      auVar36._0_8_ = local_5d0._0_8_;
      auVar35._8_8_ = 0x100000001;
      auVar35._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar36,auVar35);
      local_5d0._0_8_ = auVar3._0_8_;
      local_d0 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar3._8_8_;
      uStack_c8 = local_5d0._8_8_;
      local_e0 = 0xfffffffefffffffe;
      uStack_d8 = 0xfffffffefffffffe;
      auVar44._8_8_ = 0xfffffffefffffffe;
      auVar44._0_8_ = 0xfffffffefffffffe;
      auVar5 = vpand_avx(auVar3,auVar44);
      local_5d0._0_8_ = auVar5._0_8_;
      local_3c0 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar5._8_8_;
      uStack_3b8 = local_5d0._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar5);
      local_110 = local_5d0._0_8_;
      uStack_108 = local_5d0._8_8_;
      local_120 = 0x200000002;
      uStack_118 = 0x200000002;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar6 = vpsubd_avx(auVar5,auVar42);
      local_5d0._0_8_ = auVar6._0_8_;
      local_40 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar6._8_8_;
      uStack_38 = local_5d0._8_8_;
      local_50 = 0x400000004;
      uStack_48 = 0x400000004;
      auVar47._8_8_ = 0x400000004;
      auVar47._0_8_ = 0x400000004;
      auVar5 = vpandn_avx(auVar6,auVar47);
      local_5c0._0_8_ = auVar5._0_8_;
      local_420 = local_5c0._0_8_;
      local_5c0._8_8_ = auVar5._8_8_;
      uStack_418 = local_5c0._8_8_;
      local_424 = 0x1d;
      local_5c0 = vpslld_avx(auVar5,ZEXT416(0x1d));
      local_f0 = local_5d0._0_8_;
      uStack_e8 = local_5d0._8_8_;
      auVar43._8_8_ = 0x200000002;
      auVar43._0_8_ = 0x200000002;
      auVar5 = vpand_avx(auVar6,auVar43);
      local_5d0._0_8_ = auVar5._0_8_;
      local_b0 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar5._8_8_;
      uStack_a8 = local_5d0._8_8_;
      local_c0 = 0;
      local_a0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_a0._8_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_a0._8_8_;
      local_5d0 = vpcmpeqd_avx(auVar5,auVar61 << 0x40);
      local_550 = local_5c0._0_8_;
      uStack_548 = local_5c0._8_8_;
      local_5e0 = local_5c0._0_8_;
      uStack_5d8 = local_5c0._8_8_;
      local_560 = local_5d0._0_8_;
      uStack_558 = local_5d0._8_8_;
      local_5f0 = local_5d0._0_8_;
      uStack_5e8 = local_5d0._8_8_;
      local_580 = 0xbf490000bf490000;
      uStack_578 = 0xbf490000bf490000;
      local_590 = 0xb97da000b97da000;
      uStack_588 = 0xb97da000b97da000;
      local_3a8 = local_5b0;
      local_2e0 = &local_580;
      local_390 = local_570;
      local_5b0 = auVar3._0_8_;
      local_280 = local_5b0;
      uStack_5a8 = auVar3._8_8_;
      uStack_278 = uStack_5a8;
      local_290 = 0xbf490000bf490000;
      uStack_288 = 0xbf490000bf490000;
      auVar58._8_8_ = 0xbf490000bf490000;
      auVar58._0_8_ = 0xbf490000bf490000;
      local_2a0 = local_570._0_8_;
      uStack_298 = local_570._8_8_;
      auVar4 = vfmadd213ps_fma(auVar58,auVar3,auVar4);
      local_2f8 = &local_590;
      local_250 = local_5b0;
      uStack_248 = uStack_5a8;
      local_260 = 0xb97da000b97da000;
      uStack_258 = 0xb97da000b97da000;
      auVar57._8_8_ = 0xb97da000b97da000;
      auVar57._0_8_ = 0xb97da000b97da000;
      local_570._0_8_ = auVar4._0_8_;
      local_270 = local_570._0_8_;
      local_570._8_8_ = auVar4._8_8_;
      uStack_268 = local_570._8_8_;
      auVar4 = vfmadd213ps_fma(auVar57,auVar3,auVar4);
      local_310 = &local_5a0;
      local_220 = local_5b0;
      uStack_218 = uStack_5a8;
      local_230 = 0xb3222169b3222169;
      uStack_228 = 0xb3222169b3222169;
      auVar56._8_8_ = 0xb3222169b3222169;
      auVar56._0_8_ = 0xb3222169b3222169;
      local_570._0_8_ = auVar4._0_8_;
      local_240 = local_570._0_8_;
      local_570._8_8_ = auVar4._8_8_;
      uStack_238 = local_570._8_8_;
      local_570 = vfmadd213ps_fma(auVar56,auVar3,auVar4);
      uStack_5a8 = 0x37ccf5ce37ccf5ce;
      local_5b0 = (undefined1  [8])0x37ccf5ce37ccf5ce;
      local_490 = local_570._0_8_;
      uStack_488 = local_570._8_8_;
      local_480._0_4_ = local_570._0_4_;
      local_480._4_4_ = local_570._4_4_;
      uStack_478._0_4_ = local_570._8_4_;
      uStack_478._4_4_ = local_570._12_4_;
      local_600 = (float)local_480 * (float)local_480;
      fStack_5fc = local_480._4_4_ * local_480._4_4_;
      fStack_5f8 = (float)uStack_478 * (float)uStack_478;
      fStack_5f4 = uStack_478._4_4_ * uStack_478._4_4_;
      local_398 = &local_600;
      local_330 = _ps_coscof_p1;
      local_1f0 = 0x37ccf5ce37ccf5ce;
      uStack_1e8 = 0x37ccf5ce37ccf5ce;
      local_200 = CONCAT44(fStack_5fc,local_600);
      uStack_1f8 = CONCAT44(fStack_5f4,fStack_5f8);
      auVar51._4_4_ = fStack_5fc;
      auVar51._0_4_ = local_600;
      auVar51._8_4_ = fStack_5f8;
      auVar51._12_4_ = fStack_5f4;
      local_210[0] = -0.0013887316;
      local_210[1] = -0.0013887316;
      afStack_208[0] = -0.0013887316;
      afStack_208[1] = -0.0013887316;
      auVar38._8_4_ = -0.0013887316;
      auVar38._12_4_ = -0.0013887316;
      auVar38._0_4_ = -0.0013887316;
      auVar38._4_4_ = -0.0013887316;
      auVar3 = vfmadd213ps_fma(auVar51,_local_5b0,auVar38);
      local_348 = _ps_coscof_p2;
      local_5b0 = auVar3._0_8_;
      local_1c0 = local_5b0;
      uStack_5a8 = auVar3._8_8_;
      uStack_1b8 = uStack_5a8;
      local_1d0 = CONCAT44(fStack_5fc,local_600);
      uStack_1c8 = CONCAT44(fStack_5f4,fStack_5f8);
      auVar52._4_4_ = fStack_5fc;
      auVar52._0_4_ = local_600;
      auVar52._8_4_ = fStack_5f8;
      auVar52._12_4_ = fStack_5f4;
      local_1e0[0] = 0.041666646;
      local_1e0[1] = 0.041666646;
      afStack_1d8[0] = 0.041666646;
      afStack_1d8[1] = 0.041666646;
      auVar39._8_4_ = 0.041666646;
      auVar39._12_4_ = 0.041666646;
      auVar39._0_4_ = 0.041666646;
      auVar39._4_4_ = 0.041666646;
      auVar3 = vfmadd213ps_fma(auVar52,auVar3,auVar39);
      local_5b0 = auVar3._0_8_;
      uVar9 = local_5b0;
      uStack_5a8 = auVar3._8_8_;
      uVar10 = uStack_5a8;
      local_4b0 = CONCAT44(fStack_5fc,local_600);
      uStack_4a8 = CONCAT44(fStack_5f4,fStack_5f8);
      local_4a0._0_4_ = auVar3._0_4_;
      local_4a0._4_4_ = auVar3._4_4_;
      uStack_498._0_4_ = auVar3._8_4_;
      uStack_498._4_4_ = auVar3._12_4_;
      local_5b0._4_4_ = local_4a0._4_4_ * fStack_5fc;
      local_5b0._0_4_ = (float)local_4a0 * local_600;
      uStack_5a8._0_4_ = (float)uStack_498 * fStack_5f8;
      uStack_5a8._4_4_ = uStack_498._4_4_ * fStack_5f4;
      local_4c0 = local_5b0;
      uStack_4b8 = uStack_5a8;
      local_4d0 = CONCAT44(fStack_5fc,local_600);
      uStack_4c8 = CONCAT44(fStack_5f4,fStack_5f8);
      local_5b0._4_4_ = local_4a0._4_4_ * fStack_5fc * fStack_5fc;
      local_5b0._0_4_ = (float)local_4a0 * local_600 * local_600;
      uStack_5a8._0_4_ = (float)uStack_498 * fStack_5f8 * fStack_5f8;
      uStack_5a8._4_4_ = uStack_498._4_4_ * fStack_5f4 * fStack_5f4;
      local_3a0 = ::_ps_0p5;
      local_2b0 = CONCAT44(fStack_5fc,local_600);
      uStack_2a8 = CONCAT44(fStack_5f4,fStack_5f8);
      auVar53._4_4_ = fStack_5fc;
      auVar53._0_4_ = local_600;
      auVar53._8_4_ = fStack_5f8;
      auVar53._12_4_ = fStack_5f4;
      local_2c0[0] = 0.5;
      local_2c0[1] = 0.5;
      afStack_2b8[0] = 0.5;
      afStack_2b8[1] = 0.5;
      local_2d0 = local_5b0;
      uStack_2c8 = uStack_5a8;
      auVar37._8_4_ = 0.5;
      auVar37._12_4_ = 0.5;
      auVar37._0_4_ = 0.5;
      auVar37._4_4_ = 0.5;
      auVar3 = vfnmadd213ps_fma(auVar37,auVar53,_local_5b0);
      local_5b0 = auVar3._0_8_;
      uVar11 = local_5b0;
      uStack_5a8 = auVar3._8_8_;
      uVar12 = uStack_5a8;
      local_3f0 = 0x3f8000003f800000;
      uStack_3e8 = 0x3f8000003f800000;
      local_3e0._0_4_ = auVar3._0_4_;
      local_3e0._4_4_ = auVar3._4_4_;
      uStack_3d8._0_4_ = auVar3._8_4_;
      uStack_3d8._4_4_ = auVar3._12_4_;
      local_5b0._4_4_ = local_3e0._4_4_ + 1.0;
      local_5b0._0_4_ = (float)local_3e0 + 1.0;
      uStack_5a8._0_4_ = (float)uStack_3d8 + 1.0;
      uStack_5a8._4_4_ = uStack_3d8._4_4_ + 1.0;
      uStack_608 = 0xb94ca1f9b94ca1f9;
      local_610 = (undefined1  [8])0xb94ca1f9b94ca1f9;
      local_380 = local_610;
      local_360 = _ps_sincof_p1;
      local_190 = 0xb94ca1f9b94ca1f9;
      uStack_188 = 0xb94ca1f9b94ca1f9;
      local_1a0 = CONCAT44(fStack_5fc,local_600);
      uStack_198 = CONCAT44(fStack_5f4,fStack_5f8);
      auVar54._4_4_ = fStack_5fc;
      auVar54._0_4_ = local_600;
      auVar54._8_4_ = fStack_5f8;
      auVar54._12_4_ = fStack_5f4;
      local_1b0[0] = 0.008332161;
      local_1b0[1] = 0.008332161;
      afStack_1a8[0] = 0.008332161;
      afStack_1a8[1] = 0.008332161;
      auVar40._8_4_ = 0.008332161;
      auVar40._12_4_ = 0.008332161;
      auVar40._0_4_ = 0.008332161;
      auVar40._4_4_ = 0.008332161;
      auVar3 = vfmadd213ps_fma(auVar54,_local_610,auVar40);
      local_378 = _ps_sincof_p2;
      local_610 = auVar3._0_8_;
      local_160 = local_610;
      uStack_608 = auVar3._8_8_;
      uStack_158 = uStack_608;
      local_170 = CONCAT44(fStack_5fc,local_600);
      uStack_168 = CONCAT44(fStack_5f4,fStack_5f8);
      auVar55._4_4_ = fStack_5fc;
      auVar55._0_4_ = local_600;
      auVar55._8_4_ = fStack_5f8;
      auVar55._12_4_ = fStack_5f4;
      local_180[0] = -0.16666655;
      local_180[1] = -0.16666655;
      afStack_178[0] = -0.16666655;
      afStack_178[1] = -0.16666655;
      auVar41._8_4_ = -0.16666655;
      auVar41._12_4_ = -0.16666655;
      auVar41._0_4_ = -0.16666655;
      auVar41._4_4_ = -0.16666655;
      auVar3 = vfmadd213ps_fma(auVar55,auVar3,auVar41);
      local_610 = auVar3._0_8_;
      uVar13 = local_610;
      uStack_608 = auVar3._8_8_;
      uVar14 = uStack_608;
      local_4f0 = CONCAT44(fStack_5fc,local_600);
      uStack_4e8 = CONCAT44(fStack_5f4,fStack_5f8);
      local_4e0._0_4_ = auVar3._0_4_;
      local_4e0._4_4_ = auVar3._4_4_;
      uStack_4d8._0_4_ = auVar3._8_4_;
      uStack_4d8._4_4_ = auVar3._12_4_;
      local_610._4_4_ = local_4e0._4_4_ * fStack_5fc;
      local_610._0_4_ = (float)local_4e0 * local_600;
      uStack_608._0_4_ = (float)uStack_4d8 * fStack_5f8;
      uStack_608._4_4_ = uStack_4d8._4_4_ * fStack_5f4;
      local_130 = local_610;
      uStack_128 = uStack_608;
      local_140 = local_570._0_8_;
      uStack_138 = local_570._8_8_;
      local_150 = local_570._0_8_;
      uStack_148 = local_570._8_8_;
      auVar3 = vfmadd213ps_fma(local_570,_local_610,local_570);
      local_5a0 = local_5d0._0_8_;
      uStack_598 = local_5d0._8_8_;
      local_530 = local_5d0._0_8_;
      uStack_528 = local_5d0._8_8_;
      local_610 = auVar3._0_8_;
      local_540 = local_610;
      uStack_608 = auVar3._8_8_;
      uStack_538 = uStack_608;
      _local_610 = vpand_avx(local_5d0,auVar3);
      local_70 = local_5b0;
      uStack_68 = uStack_5a8;
      auVar3 = vpcmpeqd_avx(local_5d0,local_5d0);
      auVar46._8_8_ = uStack_5a8;
      auVar46._0_8_ = local_5b0;
      auVar3 = vpand_avx(local_5d0 ^ auVar3,auVar46);
      local_5b0 = auVar3._0_8_;
      uVar15 = local_5b0;
      uStack_5a8 = auVar3._8_8_;
      uVar16 = uStack_5a8;
      local_400._0_4_ = auVar3._0_4_;
      local_400._4_4_ = auVar3._4_4_;
      uStack_3f8._0_4_ = auVar3._8_4_;
      uStack_3f8._4_4_ = auVar3._12_4_;
      local_410._0_4_ = local_610._0_4_;
      local_410._4_4_ = local_610._4_4_;
      uStack_408._0_4_ = local_610._8_4_;
      uStack_408._4_4_ = local_610._12_4_;
      local_5b0._4_4_ = local_400._4_4_ + local_410._4_4_;
      local_5b0._0_4_ = (float)local_400 + (float)local_410;
      uStack_5a8._0_4_ = (float)uStack_3f8 + (float)uStack_408;
      uStack_5a8._4_4_ = uStack_3f8._4_4_ + uStack_408._4_4_;
      local_80 = local_5b0;
      uStack_78 = uStack_5a8;
      local_90 = local_5c0._0_8_;
      uStack_88 = local_5c0._8_8_;
      auVar45._8_8_ = uStack_5a8;
      auVar45._0_8_ = local_5b0;
      _local_5b0 = auVar45 ^ local_5c0;
      local_13d0 = local_5b0;
      uStack_13c8 = uStack_5a8;
      local_1290 = local_1350;
      local_12a0 = local_5b0;
      uStack_1298 = uStack_5a8;
      *(undefined1 (*) [16])*local_1350 = _local_5b0;
      local_1350 = (undefined1 (*) [32])(*local_1350 + 0x10);
      local_4e0 = uVar13;
      uStack_4d8 = uVar14;
      local_4a0 = uVar9;
      uStack_498 = uVar10;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_460 = uVar7;
      uStack_458 = uVar8;
      local_410 = local_610;
      uStack_408 = uStack_608;
      local_400 = uVar15;
      uStack_3f8 = uVar16;
      local_3e0 = uVar11;
      uStack_3d8 = uVar12;
      local_388 = local_390;
      local_370 = local_398;
      local_368 = local_380;
      local_358 = local_398;
      local_350 = local_380;
      local_340 = local_398;
      local_338 = local_3a8;
      local_328 = local_398;
      local_320 = local_3a8;
      local_318 = local_390;
      local_308 = local_3a8;
      local_300 = local_390;
      local_2f0 = local_3a8;
      local_2e8 = local_390;
      local_2d8 = local_3a8;
      local_100 = local_120;
      uStack_f8 = uStack_118;
      local_a0 = ZEXT816(0) << 0x20;
      local_60 = local_5d0;
    }
    for (; local_139c < local_1344; local_139c = local_139c + 1) {
      local_11e8 = local_1329;
      local_11f0 = local_1350;
      fVar64 = cosf(*(float *)*local_1350);
      *(float *)*local_1350 = fVar64;
      local_1350 = (undefined1 (*) [32])(*local_1350 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}